

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

result_type __thiscall
math::wide_integer::uniform_int_distribution<24u,unsigned_char,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<24u,unsigned_char,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  unsigned_fast_type uVar1;
  bool bVar2;
  result_type rVar3;
  local_wide_integer_type lVar4;
  uintwide_t<24U,_unsigned_char,_void,_false> uVar5;
  array<unsigned_char,_3UL> *paVar6;
  iterator puVar7;
  long lVar8;
  bool local_79;
  representation_type local_6c;
  uintwide_t<24U,_unsigned_char,_void,_false> local_65;
  uintwide_t<24U,_unsigned_char,_void,_false> local_62;
  uintwide_t<24U,_unsigned_char,_void,_false> local_5f;
  uintwide_t<24U,_unsigned_char,_void,_false> local_5c;
  uintwide_t<24U,_unsigned_char,_void,_false> local_59;
  undefined1 local_56 [2];
  result_type range;
  uintwide_t<24U,_unsigned_char,_void,_false> local_50;
  byte local_4d;
  undefined4 local_4c;
  uint8_t next_byte;
  ulong uStack_48;
  uint right_shift_amount;
  unsigned_fast_type j;
  iterator it;
  generator_result_type value;
  uint32_t digits_gtor_ratio;
  uint32_t digits_limb_ratio;
  uint32_t digits_generator_result_type;
  param_type *input_params_local;
  linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator_local;
  uniform_int_distribution<24U,_unsigned_char,_void,_false> *this_local;
  result_type result;
  
  _digits_limb_ratio = input_params;
  input_params_local = (param_type *)input_generator;
  input_generator_local = (linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *)this;
  uintwide_t<24u,unsigned_char,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
  enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std::
  numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_char>::digits),void>::type__
            ((void *)((long)&this_local + 5),'\0',
             (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
              *)0x0);
  digits_gtor_ratio = 0x20;
  value = 1;
  it._4_4_ = 4;
  it._0_4_ = 0;
  paVar6 = &uintwide_t<24U,_unsigned_char,_void,_false>::representation
                      ((uintwide_t<24U,_unsigned_char,_void,_false> *)((long)&this_local + 5))->
            super_array<unsigned_char,_3UL>;
  j = (unsigned_fast_type)detail::array_detail::array<unsigned_char,_3UL>::begin(paVar6);
  uStack_48 = 0;
  while( true ) {
    uVar1 = j;
    paVar6 = &uintwide_t<24U,_unsigned_char,_void,_false>::representation
                        ((uintwide_t<24U,_unsigned_char,_void,_false> *)((long)&this_local + 5))->
              super_array<unsigned_char,_3UL>;
    puVar7 = detail::array_detail::array<unsigned_char,_3UL>::end(paVar6);
    if ((iterator)uVar1 == puVar7) break;
    if ((uStack_48 & 3) == 0) {
      it._0_4_ = std::linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::operator()
                           ((linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *)
                            input_params_local);
    }
    lVar8 = (uStack_48 & 3) << 3;
    local_4c = (undefined4)lVar8;
    local_4d = (byte)((result_type)it >> (sbyte)lVar8);
    *(byte *)j = *(byte *)j | local_4d;
    uStack_48 = uStack_48 + 1;
    j = j + 1;
  }
  rVar3 = uniform_int_distribution<24U,_unsigned_char,_void,_false>::param_type::get_a
                    (_digits_limb_ratio);
  local_50.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
       rVar3.values.super_array<unsigned_char,_3UL>.elems._0_2_;
  local_50.values.super_array<unsigned_char,_3UL>.elems[2] =
       rVar3.values.super_array<unsigned_char,_3UL>.elems[2];
  lVar4 = numeric_limits_uintwide_t_base<24U,_unsigned_char,_void,_false>::min();
  range.values.super_array<unsigned_char,_3UL>.elems._1_2_ =
       lVar4.values.super_array<unsigned_char,_3UL>.elems._0_2_;
  bVar2 = uintwide_t<24U,_unsigned_char,_void,_false>::operator!=
                    (&local_50,
                     (uintwide_t<24U,_unsigned_char,_void,_false> *)
                     (range.values.super_array<unsigned_char,_3UL>.elems + 1));
  local_79 = true;
  if (!bVar2) {
    rVar3 = uniform_int_distribution<24U,_unsigned_char,_void,_false>::param_type::get_b
                      (_digits_limb_ratio);
    local_56 = rVar3.values.super_array<unsigned_char,_3UL>.elems._0_2_;
    range.values.super_array<unsigned_char,_3UL>.elems[0] =
         rVar3.values.super_array<unsigned_char,_3UL>.elems[2];
    lVar4 = numeric_limits_uintwide_t_base<24U,_unsigned_char,_void,_false>::max();
    local_59.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
         lVar4.values.super_array<unsigned_char,_3UL>.elems._0_2_;
    local_59.values.super_array<unsigned_char,_3UL>.elems[2] =
         lVar4.values.super_array<unsigned_char,_3UL>.elems[2];
    local_79 = uintwide_t<24U,_unsigned_char,_void,_false>::operator!=
                         ((uintwide_t<24U,_unsigned_char,_void,_false> *)local_56,&local_59);
  }
  if (local_79 != false) {
    rVar3 = uniform_int_distribution<24U,_unsigned_char,_void,_false>::param_type::get_b
                      (_digits_limb_ratio);
    local_5f.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
         rVar3.values.super_array<unsigned_char,_3UL>.elems._0_2_;
    local_5f.values.super_array<unsigned_char,_3UL>.elems[2] =
         rVar3.values.super_array<unsigned_char,_3UL>.elems[2];
    rVar3 = uniform_int_distribution<24U,_unsigned_char,_void,_false>::param_type::get_a
                      (_digits_limb_ratio);
    local_62.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
         rVar3.values.super_array<unsigned_char,_3UL>.elems._0_2_;
    local_62.values.super_array<unsigned_char,_3UL>.elems[2] =
         rVar3.values.super_array<unsigned_char,_3UL>.elems[2];
    uVar5 = wide_integer::operator-(&local_5f,&local_62);
    local_5c.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
         uVar5.values.super_array<unsigned_char,_3UL>.elems._0_2_;
    local_5c.values.super_array<unsigned_char,_3UL>.elems[2] =
         uVar5.values.super_array<unsigned_char,_3UL>.elems[2];
    uintwide_t<24U,_unsigned_char,_void,_false>::operator++(&local_5c);
    uintwide_t<24U,_unsigned_char,_void,_false>::operator%=
              ((uintwide_t<24U,_unsigned_char,_void,_false> *)((long)&this_local + 5),&local_5c);
    rVar3 = uniform_int_distribution<24U,_unsigned_char,_void,_false>::param_type::get_a
                      (_digits_limb_ratio);
    local_65.values.super_array<unsigned_char,_3UL>.elems._0_2_ =
         rVar3.values.super_array<unsigned_char,_3UL>.elems._0_2_;
    local_65.values.super_array<unsigned_char,_3UL>.elems[2] =
         rVar3.values.super_array<unsigned_char,_3UL>.elems[2];
    uintwide_t<24U,_unsigned_char,_void,_false>::operator+=
              ((uintwide_t<24U,_unsigned_char,_void,_false> *)((long)&this_local + 5),&local_65);
  }
  local_6c.super_array<unsigned_char,_3UL>.elems[2] = this_local._7_1_;
  local_6c.super_array<unsigned_char,_3UL>.elems[0] = this_local._5_1_;
  local_6c.super_array<unsigned_char,_3UL>.elems[1] = this_local._6_1_;
  return (representation_type)(representation_type)local_6c.super_array<unsigned_char,_3UL>.elems;
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }